

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult GenValidUsageInputsXrCreateSession
                   (XrInstance instance,XrSessionCreateInfo *createInfo,XrSession *session)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ValidateXrHandleResult VVar3;
  XrResult XVar4;
  GenValidUsageXrInstanceInfo *instance_info;
  char *pcVar5;
  long lVar6;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_280;
  string local_260;
  XrInstance local_240;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_238;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  local_238.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0[0]._M_dataplus._M_p._0_4_ = 1;
  local_240 = instance;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_238,&local_240,(XrObjectType *)local_1a0);
  VVar3 = VerifyXrInstanceHandle(&local_240);
  if (VVar3 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Invalid XrInstance handle \"instance\" ",0x25);
    local_260._M_dataplus._M_p = (pointer)local_240;
    paVar1 = &local_280.field_2;
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_280,'\x12');
    *local_280._M_dataplus._M_p = '0';
    local_280._M_dataplus._M_p[1] = 'x';
    pcVar5 = local_280._M_dataplus._M_p + (local_280._M_string_length - 1);
    lVar6 = 0;
    do {
      bVar2 = *(byte *)((long)&local_260._M_dataplus._M_p + lVar6);
      *pcVar5 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar5[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar6 = lVar6 + 1;
      pcVar5 = pcVar5 + -2;
    } while (lVar6 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,local_280._M_dataplus._M_p,local_280._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"VUID-xrCreateSession-instance-parameter","");
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"xrCreateSession","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1d8,&local_238);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_280,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,&local_1d8,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    XVar4 = XR_ERROR_HANDLE_INVALID;
    goto LAB_0022cc3a;
  }
  instance_info =
       HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                 (&g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>
                  ,local_240);
  paVar1 = &local_1a0[0].field_2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  if (createInfo == (XrSessionCreateInfo *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"VUID-xrCreateSession-createInfo-parameter","");
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xrCreateSession","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1f0,&local_238);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "Invalid NULL for XrSessionCreateInfo \"createInfo\" which is not optional and must be non-NULL"
               ,"");
    CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        &local_1f0,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"xrCreateSession","");
    XVar4 = ValidateXrStruct(instance_info,local_1a0,&local_238,true,true,createInfo);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
    }
    if (XVar4 != XR_SUCCESS) {
      local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"VUID-xrCreateSession-createInfo-parameter","");
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xrCreateSession","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_208,&local_238);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,"Command xrCreateSession param createInfo is invalid","");
      CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                          &local_208,&local_260);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if (local_208.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1
                       );
      }
      goto LAB_0022cc3a;
    }
    XVar4 = XR_SUCCESS;
    if (session != (XrSession *)0x0) goto LAB_0022cc3a;
    local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"VUID-xrCreateSession-session-parameter","");
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"xrCreateSession","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_220,&local_238);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "Invalid NULL for XrSession \"session\" which is not optional and must be non-NULL",
               "");
    CoreValidLogMessage(instance_info,local_1a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        &local_220,&local_260);
    local_1f0.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_220.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_1f0.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_220.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_220.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (local_1f0.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  XVar4 = XR_ERROR_VALIDATION_FAILURE;
LAB_0022cc3a:
  if (local_238.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar4;
}

Assistant:

XrResult GenValidUsageInputsXrCreateSession(
XrInstance instance,
const XrSessionCreateInfo* createInfo,
XrSession* session) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrCreateSession-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSession",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == createInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSession-createInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSession", objects_info,
                                "Invalid NULL for XrSessionCreateInfo \"createInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSessionCreateInfo is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrCreateSession", objects_info,
                                                        true, true, createInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSession-createInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSession",
                                objects_info,
                                "Command xrCreateSession param createInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == session) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateSession-session-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateSession", objects_info,
                                "Invalid NULL for XrSession \"session\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}